

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_selist.c
# Opt level: O1

void test_foreach(CuTest *tc)

{
  int iVar1;
  int counter;
  char *prev;
  critbit_tree cb;
  int local_44;
  undefined8 local_40;
  critbit_tree local_38;
  
  local_38.root = (void *)0x0;
  local_44 = 0;
  iVar1 = cb_foreach(&local_38,"herpderp",8,count_cb,&local_44);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xd5,(char *)0x0,0,iVar1);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xd6,(char *)0x0,0,local_44);
  cb_insert(&local_38,"herp",5);
  local_44 = 0;
  iVar1 = cb_foreach(&local_38,"herpderp",8,count_cb,&local_44);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xdd,(char *)0x0,0,iVar1);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xde,(char *)0x0,0,local_44);
  local_44 = 0;
  iVar1 = cb_foreach(&local_38,"",0,count_cb,&local_44);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xe2,(char *)0x0,0,iVar1);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xe3,(char *)0x0,1,local_44);
  cb_insert(&local_38,"derp",5);
  cb_insert(&local_38,"herpes",7);
  cb_insert(&local_38,"herpderp",9);
  local_44 = 0;
  iVar1 = cb_foreach(&local_38,"",0,count_cb,&local_44);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xeb,(char *)0x0,0,iVar1);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xec,(char *)0x0,4,local_44);
  local_44 = 0;
  iVar1 = cb_foreach(&local_38,"herp",0,count_cb,&local_44);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xf0,(char *)0x0,0,iVar1);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xf1,(char *)0x0,4,local_44);
  local_40 = 0;
  iVar1 = cb_foreach(&local_38,"",0,ordered_cb,&local_40);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xf6,(char *)0x0,0,iVar1);
  return;
}

Assistant:

static void test_foreach(CuTest *tc) {
    int total = 0;
    struct selist *ql = NULL;
    selist_push(&ql, (void *)lipsum);
    selist_push(&ql, (void *)lipsum);
    selist_foreach_ex(ql, callback_ctx, &total);
    CuAssertIntEquals(tc, 76, total);
    selist_foreach(ql, callback);
    CuAssertIntEquals(tc, 152, g_total);
    selist_free(ql);
}